

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
kiste::parse_context::parse_context
          (parse_context *this,istream *is,ostream *os,string *filename,bool report_exceptions,
          bool line_directives)

{
  bool line_directives_local;
  bool report_exceptions_local;
  string *filename_local;
  ostream *os_local;
  istream *is_local;
  parse_context *this_local;
  
  this->_is = is;
  this->_os = os;
  std::__cxx11::string::string((string *)&this->_filename,(string *)filename);
  this->_report_exceptions = report_exceptions;
  this->_line_directives = line_directives;
  std::__cxx11::string::string((string *)&this->_line);
  this->_line_no = 0;
  this->_curly_level = 0;
  this->_class_curly_level = 0;
  this->_has_trailing_return = false;
  return;
}

Assistant:

parse_context(std::istream& is,
                  std::ostream& os,
                  const std::string& filename,
                  bool report_exceptions,
                  bool line_directives)
        : _is(is),
          _os(os),
          _filename{filename},
          _report_exceptions{report_exceptions},
          _line_directives{line_directives}
    {
    }